

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Writer::WriteProfilingJSONFile(BP3Writer *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  BP3Base *in_RDI;
  string *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpMetadataFileNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportsNames;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bpBaseNames;
  string profileFileName;
  FileFStream profilingJSONStream;
  vector<char,_std::allocator<char>_> profilingJSON;
  string lineJSON;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilersMD;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypesMD;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  transportProfilers;
  size_t i;
  int fileTransportIdx;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transportTypes;
  ScopedTimer __var2284;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffff9e8;
  vector<char,_std::allocator<char>_> *this_01;
  FileFStream *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffffa00;
  char *in_stack_fffffffffffffa10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffa20;
  iterator in_stack_fffffffffffffa28;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffffa30;
  string *psVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa38;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffa40;
  const_iterator in_stack_fffffffffffffa48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  BP3Base *this_03;
  FileFStream *this_04;
  TransportMan *in_stack_fffffffffffffa68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffaa0;
  FileFStream *in_stack_fffffffffffffab0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_530;
  size_t in_stack_fffffffffffffae8;
  size_t in_stack_fffffffffffffaf0;
  char *in_stack_fffffffffffffaf8;
  FileFStream *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb20;
  BPSerializer *in_stack_fffffffffffffb28;
  string local_4d0 [32];
  string *local_4b0;
  undefined8 local_4a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  string local_470 [130];
  undefined1 in_stack_fffffffffffffc12;
  undefined1 in_stack_fffffffffffffc13;
  Mode in_stack_fffffffffffffc14;
  string *in_stack_fffffffffffffc18;
  FileFStream *in_stack_fffffffffffffc20;
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  *in_stack_fffffffffffffca8;
  string *in_stack_fffffffffffffcb0;
  TransportMan *in_stack_fffffffffffffcb8;
  vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>
  *in_stack_fffffffffffffd88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd90;
  BPSerializer *in_stack_fffffffffffffd98;
  vector<char,_std::allocator<char>_> local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  string local_100 [32];
  IOChrono **local_e0;
  IOChrono **local_d8;
  IOChrono **local_d0;
  IOChrono **local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  undefined1 local_90 [72];
  ulong local_48;
  int local_3c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [2];
  
  if (WriteProfilingJSONFile()::__var284 == '\0') {
    iVar2 = __cxa_guard_acquire(&WriteProfilingJSONFile()::__var284);
    if (iVar2 != 0) {
      WriteProfilingJSONFile::__var284 =
           (void *)ps_timer_create_("BP3Writer::WriteProfilingJSONFile");
      in_stack_fffffffffffffaa0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)WriteProfilingJSONFile::__var284;
      __cxa_guard_release(&WriteProfilingJSONFile()::__var284);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            ((ScopedTimer *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(in_stack_fffffffffffffa68);
  local_3c = -1;
  local_48 = 0;
  while( true ) {
    uVar1 = local_48;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_38);
    if (sVar3 <= uVar1) break;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_38,local_48);
    iVar2 = std::__cxx11::string::compare((ulong)pvVar4,0,(char *)0x4);
    if (iVar2 == 0) {
      local_3c = (int)local_48;
    }
    local_48 = local_48 + 1;
  }
  transportman::TransportMan::GetTransportsProfilers
            ((TransportMan *)in_stack_fffffffffffffa38._M_current);
  transportman::TransportMan::GetTransportsTypes_abi_cxx11_(in_stack_fffffffffffffa68);
  transportman::TransportMan::GetTransportsProfilers
            ((TransportMan *)in_stack_fffffffffffffa38._M_current);
  local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff9e8);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff9f0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffff9e8);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff9e8);
  local_b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffff9e8);
  local_b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa48,
                        in_stack_fffffffffffffa40,in_stack_fffffffffffffa38);
  this_04 = (FileFStream *)(local_90 + 0x30);
  local_c8 = (IOChrono **)
             std::
             vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
             end(in_stack_fffffffffffff9e8);
  __gnu_cxx::
  __normal_iterator<adios2::profiling::IOChrono*const*,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>
  ::__normal_iterator<adios2::profiling::IOChrono**>
            ((__normal_iterator<adios2::profiling::IOChrono_*const_*,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              *)in_stack_fffffffffffff9f0,
             (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
              *)in_stack_fffffffffffff9e8);
  this_03 = (BP3Base *)local_90;
  local_d0 = (IOChrono **)
             std::
             vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
             begin(in_stack_fffffffffffff9e8);
  local_d8 = (IOChrono **)
             std::
             vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
             end(in_stack_fffffffffffff9e8);
  local_e0 = (IOChrono **)
             std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>
             ::
             insert<__gnu_cxx::__normal_iterator<adios2::profiling::IOChrono**,std::vector<adios2::profiling::IOChrono*,std::allocator<adios2::profiling::IOChrono*>>>,void>
                       (in_stack_fffffffffffffa30,
                        (const_iterator)in_stack_fffffffffffffa48._M_current,
                        (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
                         )in_stack_fffffffffffffa40._M_current,
                        (__normal_iterator<adios2::profiling::IOChrono_**,_std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>_>
                         )in_stack_fffffffffffffa38._M_current);
  names = &local_120;
  adios2::format::BPSerializer::GetRankProfilingJSON
            (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::operator+(in_stack_fffffffffffff9f8,(char *)in_stack_fffffffffffff9f0);
  std::__cxx11::string::~string((string *)&local_120);
  adios2::format::BPSerializer::AggregateProfilingJSON
            (in_stack_fffffffffffffb28,in_stack_fffffffffffffb20);
  if (*(int *)(&in_RDI->field_0xd0 + *(long *)(*(long *)&in_RDI->field_0xc0 + -0x18)) == 0) {
    adios2::transport::FileFStream::FileFStream(this_04,(Comm *)this_03);
    std::__cxx11::string::string(local_470);
    if (local_3c < 0) {
      transportman::TransportMan::GetFilesBaseNames
                (in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      this_02 = &local_530;
      adios2::format::BP3Base::GetBPMetadataFileNames(this_03,names);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_02,0);
      std::operator+(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      std::__cxx11::string::operator=(local_470,(string *)&stack0xfffffffffffffab0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffab0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa00);
    }
    else {
      std::__cxx11::string::string(local_4d0,(string *)&in_RDI->field_0x30);
      local_4b0 = local_4d0;
      local_4a8 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0xa01952);
      __l._M_len = (size_type)in_stack_fffffffffffffa30;
      __l._M_array = in_stack_fffffffffffffa28;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffa20,__l,(allocator_type *)in_stack_fffffffffffffa18);
      adios2::format::BP3Base::GetBPBaseNames(in_RDI,in_stack_fffffffffffffaa0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa00);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0xa019aa);
      psVar5 = local_4d0;
      this_00 = (string *)&local_4b0;
      do {
        this_00 = this_00 + -0x20;
        std::__cxx11::string::~string(this_00);
      } while (this_00 != psVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_488,(long)local_3c);
      std::operator+(in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
      std::__cxx11::string::operator=(local_470,(string *)&stack0xfffffffffffffb00);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffb00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa00);
    }
    adios2::transport::FileFStream::Open
              (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18,in_stack_fffffffffffffc14,
               (bool)in_stack_fffffffffffffc13,(bool)in_stack_fffffffffffffc12);
    this_01 = &local_138;
    in_stack_fffffffffffff9f0 =
         (FileFStream *)
         std::vector<char,_std::allocator<char>_>::data
                   ((vector<char,_std::allocator<char>_> *)0xa01ce0);
    std::vector<char,_std::allocator<char>_>::size(this_01);
    adios2::transport::FileFStream::Write
              (in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
               in_stack_fffffffffffffae8);
    adios2::transport::FileFStream::Close(in_stack_fffffffffffffab0);
    std::__cxx11::string::~string(local_470);
    adios2::transport::FileFStream::~FileFStream(in_stack_fffffffffffff9f0);
  }
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffa00);
  std::__cxx11::string::~string(local_100);
  std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~vector(in_stack_fffffffffffffa00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa00);
  std::vector<adios2::profiling::IOChrono_*,_std::allocator<adios2::profiling::IOChrono_*>_>::
  ~vector(in_stack_fffffffffffffa00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffa00);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)in_stack_fffffffffffff9f0);
  return;
}

Assistant:

void BP3Writer::WriteProfilingJSONFile()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::WriteProfilingJSONFile");
    auto transportTypes = m_FileDataManager.GetTransportsTypes();

    // find first File type output, where we can write the profile
    int fileTransportIdx = -1;
    for (size_t i = 0; i < transportTypes.size(); ++i)
    {
        if (transportTypes[i].compare(0, 4, "File") == 0)
        {
            fileTransportIdx = static_cast<int>(i);
        }
    }

    auto transportProfilers = m_FileDataManager.GetTransportsProfilers();

    auto transportTypesMD = m_FileMetadataManager.GetTransportsTypes();
    auto transportProfilersMD = m_FileMetadataManager.GetTransportsProfilers();

    transportTypes.insert(transportTypes.end(), transportTypesMD.begin(), transportTypesMD.end());

    transportProfilers.insert(transportProfilers.end(), transportProfilersMD.begin(),
                              transportProfilersMD.end());

    const std::string lineJSON(
        m_BP3Serializer.GetRankProfilingJSON(transportTypes, transportProfilers) + ",\n");

    const std::vector<char> profilingJSON(m_BP3Serializer.AggregateProfilingJSON(lineJSON));

    if (m_BP3Serializer.m_RankMPI == 0)
    {
        transport::FileFStream profilingJSONStream(m_Comm);
        std::string profileFileName;
        if (fileTransportIdx > -1)
        {
            // write profile to <filename.bp>.dir/profiling.json
            auto bpBaseNames = m_BP3Serializer.GetBPBaseNames({m_Name});
            profileFileName = bpBaseNames[fileTransportIdx] + "/profiling.json";
        }
        else
        {
            // write profile to <filename.bp>_profiling.json
            auto transportsNames =
                m_FileMetadataManager.GetFilesBaseNames(m_Name, m_IO.m_TransportsParameters);

            auto bpMetadataFileNames = m_BP3Serializer.GetBPMetadataFileNames(transportsNames);
            profileFileName = bpMetadataFileNames[0] + "_profiling.json";
        }
        profilingJSONStream.Open(profileFileName, Mode::Write);
        profilingJSONStream.Write(profilingJSON.data(), profilingJSON.size());
        profilingJSONStream.Close();
    }
}